

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O0

result * __thiscall
lest::expression_lhs<(anonymous_namespace)::logic_t_const&>::operator==
          (result *__return_storage_ptr__,
          expression_lhs<(anonymous_namespace)::logic_t_const&> *this,logic_t *rhs)

{
  logic_t *lhs;
  allocator local_d1;
  string local_d0 [32];
  string local_b0 [32];
  lest local_90 [32];
  string local_70 [32];
  int local_50;
  logic_t local_4c;
  result local_48;
  logic_t *local_20;
  logic_t *rhs_local;
  expression_lhs<const_(anonymous_namespace)::logic_t_&> *this_local;
  
  local_50 = rhs->value;
  local_20 = rhs;
  rhs_local = (logic_t *)this;
  this_local = (expression_lhs<const_(anonymous_namespace)::logic_t_&> *)__return_storage_ptr__;
  local_4c = anon_unknown.dwarf_cd8d::logic_t::operator==(*(logic_t **)this,local_50);
  lhs = *(logic_t **)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d0,"==",&local_d1);
  std::__cxx11::string::string(local_b0,local_d0);
  to_string<(anonymous_namespace)::logic_t,(anonymous_namespace)::logic_t>
            (local_90,lhs,(string *)local_b0,local_20);
  std::__cxx11::string::string(local_70,(string *)local_90);
  result::result<(anonymous_namespace)::logic_t>(&local_48,&local_4c,(text *)local_70);
  result::result(__return_storage_ptr__,&local_48);
  result::~result(&local_48);
  std::__cxx11::string::~string(local_70);
  std::__cxx11::string::~string((string *)local_90);
  std::__cxx11::string::~string(local_b0);
  std::__cxx11::string::~string(local_d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_d1);
  return __return_storage_ptr__;
}

Assistant:

result operator< ( R const & rhs ) { return result( lhs <  rhs, to_string( lhs, "<" , rhs ) ); }